

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::UnsafeArenaSwapFields
          (Reflection *this,Message *lhs,Message *rhs,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *fields)

{
  Arena *pAVar1;
  Arena *pAVar2;
  LogMessage *other;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_28;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  Message *rhs_local;
  Message *lhs_local;
  Reflection *this_local;
  
  local_28 = fields;
  fields_local = (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)rhs;
  rhs_local = lhs;
  lhs_local = (Message *)this;
  pAVar1 = MessageLite::GetArenaForAllocation(&lhs->super_MessageLite);
  pAVar2 = MessageLite::GetArenaForAllocation((MessageLite *)fields_local);
  local_61 = 0;
  if (pAVar1 != pAVar2) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x41e);
    local_61 = 1;
    other = internal::LogMessage::operator<<
                      (&local_60,
                       "CHECK failed: (lhs->GetArenaForAllocation()) == (rhs->GetArenaForAllocation()): "
                      );
    internal::LogFinisher::operator=(local_75,other);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  UnsafeShallowSwapFields(this,rhs_local,(Message *)fields_local,local_28);
  return;
}

Assistant:

void Reflection::UnsafeArenaSwapFields(
    Message* lhs, Message* rhs,
    const std::vector<const FieldDescriptor*>& fields) const {
  GOOGLE_DCHECK_EQ(lhs->GetArenaForAllocation(), rhs->GetArenaForAllocation());
  UnsafeShallowSwapFields(lhs, rhs, fields);
}